

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address_base.cpp
# Opt level: O2

GetAddressInfoResponseStruct *
cfd::js::api::AddressApiBase::GetAddressInfo
          (GetAddressInfoResponseStruct *__return_storage_ptr__,GetAddressInfoRequestStruct *request
          ,AddressFactory *address_factory,Address *address_data)

{
  AddressType address_type;
  Address address;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1f0;
  Script local_1d0;
  string local_198 [4];
  uint local_194;
  int local_190;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_168 [13];
  
  GetAddressInfoResponseStruct::GetAddressInfoResponseStruct(__return_storage_ptr__);
  cfd::AddressFactory::GetAddress(local_198);
  if (address_data != (Address *)0x0) {
    cfd::core::Address::operator=(address_data,(Address *)local_198);
  }
  cfd::core::Address::GetLockingScript();
  cfd::core::Script::GetHex_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_1f0);
  core::Script::~Script(&local_1d0);
  ConvertAddressTypeString_abi_cxx11_
            ((string *)&local_1d0,(AddressApiBase *)(ulong)local_194,address_type);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->hash_type,(string *)&local_1d0)
  ;
  std::__cxx11::string::~string((string *)&local_1d0);
  __return_storage_ptr__->witness_version = local_190;
  if (local_190 < 0) {
    std::__cxx11::string::string((string *)&local_1d0,"witnessVersion",(allocator *)&local_1f0);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&__return_storage_ptr__->ignore_items,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1f0,local_168);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->hash,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1f0);
  core::Address::~Address((Address *)local_198);
  return __return_storage_ptr__;
}

Assistant:

GetAddressInfoResponseStruct AddressApiBase::GetAddressInfo(
    const GetAddressInfoRequestStruct& request,
    const AddressFactory* address_factory, Address* address_data) {
  GetAddressInfoResponseStruct response;
  Address address = address_factory->GetAddress(request.address);
  if (address_data != nullptr) *address_data = address;

  response.locking_script = address.GetLockingScript().GetHex();
  response.hash_type = ConvertAddressTypeText(address.GetAddressType());
  response.witness_version = static_cast<int32_t>(address.GetWitnessVersion());
  if (response.witness_version < 0) {
    response.ignore_items.insert("witnessVersion");
  }
  response.hash = address.GetHash().GetHex();
  return response;
}